

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# masked_variance_intrin_ssse3.c
# Opt level: O0

void bilinear_filter(uint8_t *src,int src_stride,int xoffset,int yoffset,uint8_t *dst,int w,int h)

{
  uint8_t auVar1 [2];
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  __m128i filter;
  __m128i filter_00;
  __m128i b_00;
  __m128i b_01;
  __m128i a;
  __m128i a_00;
  undefined1 auVar6 [16];
  undefined1 (*pauVar7) [16];
  undefined8 *puVar8;
  longlong *plVar9;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  long in_R8;
  int in_R9D;
  undefined1 uVar10;
  undefined1 uVar11;
  undefined1 uVar12;
  undefined1 uVar13;
  undefined1 uVar14;
  undefined1 uVar15;
  undefined1 uVar16;
  undefined8 extraout_XMM0_Qa;
  undefined1 uVar17;
  undefined8 extraout_XMM0_Qa_00;
  undefined1 uVar18;
  undefined1 uVar19;
  undefined1 uVar20;
  undefined1 uVar21;
  undefined1 uVar22;
  undefined1 uVar23;
  undefined1 uVar24;
  undefined8 extraout_XMM0_Qb;
  undefined1 uVar25;
  longlong extraout_XMM0_Qb_00;
  int in_stack_00000008;
  __m128i res_1;
  __m128i y_3;
  __m128i x_4;
  __m128i vfilter_vec;
  uint8_t *vfilter;
  __m128i y_2;
  __m128i x_3;
  __m128i res;
  __m128i z_1;
  __m128i y_1;
  __m128i x_2;
  __m128i hfilter_vec;
  uint8_t *hfilter;
  uint8_t *b_2;
  __m128i z;
  __m128i y;
  __m128i x_1;
  uint8_t *b_1;
  __m128i x;
  uint8_t *b;
  int j;
  int i;
  longlong in_stack_fffffffffffffd30;
  longlong in_stack_fffffffffffffd38;
  longlong in_stack_fffffffffffffd40;
  longlong in_stack_fffffffffffffd48;
  longlong in_stack_fffffffffffffd50;
  longlong in_stack_fffffffffffffd58;
  longlong lVar26;
  long local_210;
  long local_1d0;
  long local_1b8;
  int local_1ac;
  int local_1a8;
  long local_1a0;
  long local_188;
  undefined1 local_98;
  undefined1 uStack_97;
  undefined1 uStack_96;
  undefined1 uStack_95;
  undefined1 uStack_94;
  undefined1 uStack_93;
  undefined1 uStack_92;
  undefined1 uStack_91;
  undefined1 uStack_90;
  undefined1 uStack_8f;
  undefined1 uStack_8e;
  undefined1 uStack_8d;
  undefined1 uStack_8c;
  undefined1 uStack_8b;
  undefined1 uStack_8a;
  undefined1 uStack_89;
  undefined1 local_88;
  undefined1 uStack_87;
  undefined1 uStack_86;
  undefined1 uStack_85;
  undefined1 uStack_84;
  undefined1 uStack_83;
  undefined1 uStack_82;
  undefined1 uStack_81;
  undefined1 uStack_80;
  undefined1 uStack_7f;
  undefined1 uStack_7e;
  undefined1 uStack_7d;
  undefined1 uStack_7c;
  undefined1 uStack_7b;
  undefined1 uStack_7a;
  undefined1 uStack_79;
  undefined1 local_78;
  undefined1 uStack_77;
  undefined1 uStack_76;
  undefined1 uStack_75;
  undefined1 uStack_74;
  undefined1 uStack_73;
  undefined1 uStack_72;
  undefined1 uStack_71;
  undefined1 uStack_70;
  undefined1 uStack_6f;
  undefined1 uStack_6e;
  undefined1 uStack_6d;
  undefined1 uStack_6c;
  undefined1 uStack_6b;
  undefined1 uStack_6a;
  undefined1 uStack_69;
  undefined1 local_68;
  undefined1 uStack_67;
  undefined1 uStack_66;
  undefined1 uStack_65;
  undefined1 uStack_64;
  undefined1 uStack_63;
  undefined1 uStack_62;
  undefined1 uStack_61;
  undefined1 uStack_60;
  undefined1 uStack_5f;
  undefined1 uStack_5e;
  undefined1 uStack_5d;
  undefined1 uStack_5c;
  undefined1 uStack_5b;
  undefined1 uStack_5a;
  undefined1 uStack_59;
  
  local_188 = in_RDI;
  if (in_EDX == 0) {
    local_1b8 = in_R8;
    for (local_1a8 = 0; local_1a8 < in_stack_00000008 + 1; local_1a8 = local_1a8 + 1) {
      for (local_1ac = 0; local_1ac < in_R9D; local_1ac = local_1ac + 0x10) {
        uVar2 = ((undefined8 *)(local_188 + local_1ac))[1];
        *(undefined8 *)(local_1b8 + local_1ac) = *(undefined8 *)(local_188 + local_1ac);
        ((undefined8 *)(local_1b8 + local_1ac))[1] = uVar2;
      }
      local_188 = local_188 + in_ESI;
      local_1b8 = local_1b8 + in_R9D;
    }
  }
  else if (in_EDX == 4) {
    local_1d0 = in_R8;
    for (local_1a8 = 0; local_1a8 < in_stack_00000008 + 1; local_1a8 = local_1a8 + 1) {
      for (local_1ac = 0; local_1ac < in_R9D; local_1ac = local_1ac + 0x10) {
        pauVar7 = (undefined1 (*) [16])(local_188 + local_1ac);
        uVar2 = *(undefined8 *)*pauVar7;
        uVar3 = *(undefined8 *)(*pauVar7 + 8);
        auVar6 = *pauVar7;
        local_68 = (undefined1)uVar2;
        uStack_67 = (undefined1)((ulong)uVar2 >> 8);
        uStack_66 = (undefined1)((ulong)uVar2 >> 0x10);
        uStack_65 = (undefined1)((ulong)uVar2 >> 0x18);
        uStack_64 = (undefined1)((ulong)uVar2 >> 0x20);
        uStack_63 = (undefined1)((ulong)uVar2 >> 0x28);
        uStack_62 = (undefined1)((ulong)uVar2 >> 0x30);
        uStack_61 = (undefined1)((ulong)uVar2 >> 0x38);
        uStack_60 = (undefined1)uVar3;
        uStack_5f = (undefined1)((ulong)uVar3 >> 8);
        uStack_5e = (undefined1)((ulong)uVar3 >> 0x10);
        uStack_5d = (undefined1)((ulong)uVar3 >> 0x18);
        uStack_5c = (undefined1)((ulong)uVar3 >> 0x20);
        uStack_5b = (undefined1)((ulong)uVar3 >> 0x28);
        uStack_5a = (undefined1)((ulong)uVar3 >> 0x30);
        uStack_59 = (undefined1)((ulong)uVar3 >> 0x38);
        local_78 = auVar6[1];
        uStack_77 = auVar6[2];
        uStack_76 = auVar6[3];
        uStack_75 = auVar6[4];
        uStack_74 = auVar6[5];
        uStack_73 = auVar6[6];
        uStack_72 = auVar6[7];
        uStack_71 = auVar6[8];
        uStack_70 = auVar6[9];
        uStack_6f = auVar6[10];
        uStack_6e = auVar6[0xb];
        uStack_6d = auVar6[0xc];
        uStack_6c = auVar6[0xd];
        uStack_6b = auVar6[0xe];
        uStack_6a = auVar6[0xf];
        uStack_69 = SUB161(*(undefined1 (*) [16])((long)local_1ac + 0x10 + local_188),0);
        uVar10 = pavgb(local_68,local_78);
        uVar11 = pavgb(uStack_67,uStack_77);
        uVar12 = pavgb(uStack_66,uStack_76);
        uVar13 = pavgb(uStack_65,uStack_75);
        uVar14 = pavgb(uStack_64,uStack_74);
        uVar15 = pavgb(uStack_63,uStack_73);
        uVar16 = pavgb(uStack_62,uStack_72);
        uVar17 = pavgb(uStack_61,uStack_71);
        uVar18 = pavgb(uStack_60,uStack_70);
        uVar19 = pavgb(uStack_5f,uStack_6f);
        uVar20 = pavgb(uStack_5e,uStack_6e);
        uVar21 = pavgb(uStack_5d,uStack_6d);
        uVar22 = pavgb(uStack_5c,uStack_6c);
        uVar23 = pavgb(uStack_5b,uStack_6b);
        uVar24 = pavgb(uStack_5a,uStack_6a);
        uVar25 = pavgb(uStack_59,uStack_69);
        *(undefined8 *)(local_1d0 + local_1ac) =
             CONCAT17(uVar17,CONCAT16(uVar16,CONCAT15(uVar15,CONCAT14(uVar14,CONCAT13(uVar13,
                                                  CONCAT12(uVar12,CONCAT11(uVar11,uVar10)))))));
        ((undefined8 *)(local_1d0 + local_1ac))[1] =
             CONCAT17(uVar25,CONCAT16(uVar24,CONCAT15(uVar23,CONCAT14(uVar22,CONCAT13(uVar21,
                                                  CONCAT12(uVar20,CONCAT11(uVar19,uVar18)))))));
      }
      local_188 = local_188 + in_ESI;
      local_1d0 = local_1d0 + in_R9D;
    }
  }
  else {
    local_210 = in_R8;
    for (local_1a8 = 0; local_1a8 < in_stack_00000008 + 1; local_1a8 = local_1a8 + 1) {
      for (local_1ac = 0; local_1ac < in_R9D; local_1ac = local_1ac + 0x10) {
        a[1] = in_stack_fffffffffffffd58;
        a[0] = in_stack_fffffffffffffd50;
        b_00[1] = in_stack_fffffffffffffd48;
        b_00[0] = in_stack_fffffffffffffd40;
        filter[1] = in_stack_fffffffffffffd38;
        filter[0] = in_stack_fffffffffffffd30;
        filter_block(a,b_00,filter);
        *(undefined8 *)(local_210 + local_1ac) = extraout_XMM0_Qa;
        ((undefined8 *)(local_210 + local_1ac))[1] = extraout_XMM0_Qb;
      }
      local_210 = local_210 + in_R9D;
    }
  }
  if (in_ECX != 0) {
    local_1a0 = in_R8;
    if (in_ECX == 4) {
      for (local_1a8 = 0; local_1a8 < in_stack_00000008; local_1a8 = local_1a8 + 1) {
        for (local_1ac = 0; local_1ac < in_R9D; local_1ac = local_1ac + 0x10) {
          uVar2 = *(undefined8 *)(local_1a0 + local_1ac);
          uVar3 = ((undefined8 *)(local_1a0 + local_1ac))[1];
          puVar8 = (undefined8 *)(local_1a0 + (local_1ac + in_R9D));
          uVar4 = *puVar8;
          uVar5 = puVar8[1];
          local_88 = (undefined1)uVar2;
          uStack_87 = (undefined1)((ulong)uVar2 >> 8);
          uStack_86 = (undefined1)((ulong)uVar2 >> 0x10);
          uStack_85 = (undefined1)((ulong)uVar2 >> 0x18);
          uStack_84 = (undefined1)((ulong)uVar2 >> 0x20);
          uStack_83 = (undefined1)((ulong)uVar2 >> 0x28);
          uStack_82 = (undefined1)((ulong)uVar2 >> 0x30);
          uStack_81 = (undefined1)((ulong)uVar2 >> 0x38);
          uStack_80 = (undefined1)uVar3;
          uStack_7f = (undefined1)((ulong)uVar3 >> 8);
          uStack_7e = (undefined1)((ulong)uVar3 >> 0x10);
          uStack_7d = (undefined1)((ulong)uVar3 >> 0x18);
          uStack_7c = (undefined1)((ulong)uVar3 >> 0x20);
          uStack_7b = (undefined1)((ulong)uVar3 >> 0x28);
          uStack_7a = (undefined1)((ulong)uVar3 >> 0x30);
          uStack_79 = (undefined1)((ulong)uVar3 >> 0x38);
          local_98 = (undefined1)uVar4;
          uStack_97 = (undefined1)((ulong)uVar4 >> 8);
          uStack_96 = (undefined1)((ulong)uVar4 >> 0x10);
          uStack_95 = (undefined1)((ulong)uVar4 >> 0x18);
          uStack_94 = (undefined1)((ulong)uVar4 >> 0x20);
          uStack_93 = (undefined1)((ulong)uVar4 >> 0x28);
          uStack_92 = (undefined1)((ulong)uVar4 >> 0x30);
          uStack_91 = (undefined1)((ulong)uVar4 >> 0x38);
          uStack_90 = (undefined1)uVar5;
          uStack_8f = (undefined1)((ulong)uVar5 >> 8);
          uStack_8e = (undefined1)((ulong)uVar5 >> 0x10);
          uStack_8d = (undefined1)((ulong)uVar5 >> 0x18);
          uStack_8c = (undefined1)((ulong)uVar5 >> 0x20);
          uStack_8b = (undefined1)((ulong)uVar5 >> 0x28);
          uStack_8a = (undefined1)((ulong)uVar5 >> 0x30);
          uStack_89 = (undefined1)((ulong)uVar5 >> 0x38);
          uVar10 = pavgb(local_88,local_98);
          uVar11 = pavgb(uStack_87,uStack_97);
          uVar12 = pavgb(uStack_86,uStack_96);
          uVar13 = pavgb(uStack_85,uStack_95);
          uVar14 = pavgb(uStack_84,uStack_94);
          uVar15 = pavgb(uStack_83,uStack_93);
          uVar16 = pavgb(uStack_82,uStack_92);
          uVar17 = pavgb(uStack_81,uStack_91);
          uVar18 = pavgb(uStack_80,uStack_90);
          uVar19 = pavgb(uStack_7f,uStack_8f);
          uVar20 = pavgb(uStack_7e,uStack_8e);
          uVar21 = pavgb(uStack_7d,uStack_8d);
          uVar22 = pavgb(uStack_7c,uStack_8c);
          uVar23 = pavgb(uStack_7b,uStack_8b);
          uVar24 = pavgb(uStack_7a,uStack_8a);
          uVar25 = pavgb(uStack_79,uStack_89);
          *(undefined8 *)(local_1a0 + local_1ac) =
               CONCAT17(uVar17,CONCAT16(uVar16,CONCAT15(uVar15,CONCAT14(uVar14,CONCAT13(uVar13,
                                                  CONCAT12(uVar12,CONCAT11(uVar11,uVar10)))))));
          ((undefined8 *)(local_1a0 + local_1ac))[1] =
               CONCAT17(uVar25,CONCAT16(uVar24,CONCAT15(uVar23,CONCAT14(uVar22,CONCAT13(uVar21,
                                                  CONCAT12(uVar20,CONCAT11(uVar19,uVar18)))))));
        }
        local_1a0 = local_1a0 + in_R9D;
      }
    }
    else {
      auVar1 = bilinear_filters_2t[in_ECX];
      lVar26 = CONCAT26(auVar1,CONCAT24(auVar1,CONCAT22(auVar1,auVar1)));
      for (local_1a8 = 0; local_1a8 < in_stack_00000008; local_1a8 = local_1a8 + 1) {
        for (local_1ac = 0; local_1ac < in_R9D; local_1ac = local_1ac + 0x10) {
          plVar9 = (longlong *)(local_1a0 + (local_1ac + in_R9D));
          a_00[1] = lVar26;
          a_00[0] = ((longlong *)(local_1a0 + local_1ac))[1];
          b_01[1] = *(longlong *)(local_1a0 + local_1ac);
          b_01[0] = plVar9[1];
          filter_00[1] = *plVar9;
          filter_00[0] = in_stack_fffffffffffffd30;
          filter_block(a_00,b_01,filter_00);
          *(undefined8 *)(local_1a0 + local_1ac) = extraout_XMM0_Qa_00;
          ((undefined8 *)(local_1a0 + local_1ac))[1] = extraout_XMM0_Qb_00;
          in_stack_fffffffffffffd30 = extraout_XMM0_Qb_00;
        }
        local_1a0 = local_1a0 + in_R9D;
      }
    }
  }
  return;
}

Assistant:

static void bilinear_filter(const uint8_t *src, int src_stride, int xoffset,
                            int yoffset, uint8_t *dst, int w, int h) {
  int i, j;
  // Horizontal filter
  if (xoffset == 0) {
    uint8_t *b = dst;
    for (i = 0; i < h + 1; ++i) {
      for (j = 0; j < w; j += 16) {
        __m128i x = _mm_loadu_si128((__m128i *)&src[j]);
        _mm_storeu_si128((__m128i *)&b[j], x);
      }
      src += src_stride;
      b += w;
    }
  } else if (xoffset == 4) {
    uint8_t *b = dst;
    for (i = 0; i < h + 1; ++i) {
      for (j = 0; j < w; j += 16) {
        __m128i x = _mm_loadu_si128((__m128i *)&src[j]);
        __m128i y = _mm_loadu_si128((__m128i *)&src[j + 16]);
        __m128i z = _mm_alignr_epi8(y, x, 1);
        _mm_storeu_si128((__m128i *)&b[j], _mm_avg_epu8(x, z));
      }
      src += src_stride;
      b += w;
    }
  } else {
    uint8_t *b = dst;
    const uint8_t *hfilter = bilinear_filters_2t[xoffset];
    const __m128i hfilter_vec = _mm_set1_epi16(hfilter[0] | (hfilter[1] << 8));
    for (i = 0; i < h + 1; ++i) {
      for (j = 0; j < w; j += 16) {
        const __m128i x = _mm_loadu_si128((__m128i *)&src[j]);
        const __m128i y = _mm_loadu_si128((__m128i *)&src[j + 16]);
        const __m128i z = _mm_alignr_epi8(y, x, 1);
        const __m128i res = filter_block(x, z, hfilter_vec);
        _mm_storeu_si128((__m128i *)&b[j], res);
      }

      src += src_stride;
      b += w;
    }
  }

  // Vertical filter
  if (yoffset == 0) {
    // The data is already in 'dst', so no need to filter
  } else if (yoffset == 4) {
    for (i = 0; i < h; ++i) {
      for (j = 0; j < w; j += 16) {
        __m128i x = _mm_loadu_si128((__m128i *)&dst[j]);
        __m128i y = _mm_loadu_si128((__m128i *)&dst[j + w]);
        _mm_storeu_si128((__m128i *)&dst[j], _mm_avg_epu8(x, y));
      }
      dst += w;
    }
  } else {
    const uint8_t *vfilter = bilinear_filters_2t[yoffset];
    const __m128i vfilter_vec = _mm_set1_epi16(vfilter[0] | (vfilter[1] << 8));
    for (i = 0; i < h; ++i) {
      for (j = 0; j < w; j += 16) {
        const __m128i x = _mm_loadu_si128((__m128i *)&dst[j]);
        const __m128i y = _mm_loadu_si128((__m128i *)&dst[j + w]);
        const __m128i res = filter_block(x, y, vfilter_vec);
        _mm_storeu_si128((__m128i *)&dst[j], res);
      }

      dst += w;
    }
  }
}